

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODMultiUPCEANReader.cpp
# Opt level: O3

bool ZXing::OneD::AddOn(PartialResult *res,PatternView begin,int digitCount)

{
  char *__nptr;
  pointer pcVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  Iterator puVar6;
  int *piVar7;
  undefined8 uVar8;
  bool bVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  int CHECK_DIGIT_ENCODINGS [10];
  int local_8c;
  PatternView local_88;
  double local_68;
  double local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_88._size = digitCount * 6 + 1;
  local_88._data = begin._data;
  local_88._base = begin._base;
  local_88._end = begin._end;
  if (begin._data == (Iterator)0x0) {
    return false;
  }
  if (begin._data < begin._base) {
    return false;
  }
  if (begin._end < begin._data + (uint)local_88._size) {
    return false;
  }
  dVar2 = IsPattern<false,3,4>(&local_88,(FixedPattern<3,_4,_false> *)&EXT_START_PATTERN,0,0.0,0.0);
  if ((dVar2 == 0.0) && (!NAN(dVar2))) {
    return false;
  }
  if ((local_88._data + local_88._size == local_88._end + -1) ||
     (dVar2 * 3.0 + -1.0 < (double)local_88._data[local_88._size])) {
    (res->end)._base = local_88._base;
    (res->end)._end = local_88._end;
    (res->end)._data = local_88._data;
    *(ulong *)&(res->end)._size = CONCAT44(local_88._12_4_,local_88._size);
    local_88._data = local_88._data + 3;
    local_88._size = 4;
    local_8c = 0;
    (res->txt)._M_string_length = 0;
    *(res->txt)._M_dataplus._M_p = '\0';
    if (digitCount < 1) {
LAB_0016502e:
      local_48 = 0x60000000c;
      uStack_40 = 0xa00000003;
      local_58 = 0x18;
      uStack_54 = 0x14;
      uStack_50 = 0x12;
      uStack_4c = 0x11;
      local_38 = 0x500000009;
      pcVar1 = (res->txt)._M_dataplus._M_p;
      iVar13 = 0;
      uVar4 = (uint)(res->txt)._M_string_length;
      if (1 < (int)uVar4) {
        uVar12 = (ulong)(uVar4 & 0x7fffffff) + 2;
        iVar13 = 0;
        do {
          iVar13 = iVar13 + pcVar1[uVar12 - 4] + -0x30;
          uVar12 = uVar12 - 2;
        } while (3 < uVar12);
        iVar13 = iVar13 * 3;
      }
      if (0 < (int)uVar4) {
        uVar12 = (ulong)(uVar4 - 1) + 2;
        do {
          iVar13 = iVar13 + pcVar1[uVar12 - 2] + -0x30;
          uVar12 = uVar12 - 2;
        } while (1 < uVar12);
      }
      piVar7 = std::__find_if<int_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                         (&local_58,&stack0xffffffffffffffd0,&local_8c);
      iVar5 = -1;
      if (piVar7 != (int *)&stack0xffffffffffffffd0) {
        iVar5 = (int)((ulong)((long)piVar7 - (long)&local_58) >> 2);
      }
      if ((iVar13 * 3) % 10 != iVar5) goto LAB_0016501b;
    }
    else {
      local_68 = dVar2 * 0.5 + 0.5;
      iVar13 = 0;
      local_60 = dVar2;
      do {
        bVar3 = DecodeDigit(&local_88,&res->txt,&local_8c);
        if (!bVar3) goto LAB_0016501b;
        if (local_88._data == (Iterator)0x0) {
          puVar6 = (Iterator)0x0;
        }
        else {
          puVar6 = local_88._data + local_88._size;
          local_88._data = puVar6;
        }
        if (iVar13 < digitCount + -1) {
          dVar2 = (double)(ushort)(puVar6[1] + *puVar6) * 0.5;
          lVar11 = 0;
          bVar3 = true;
          do {
            bVar9 = bVar3;
            if (local_68 < ABS((double)puVar6[lVar11] - local_60)) goto LAB_0016501b;
            lVar11 = 1;
            bVar3 = false;
          } while (bVar9);
          if ((dVar2 == 0.0) && (!NAN(dVar2))) goto LAB_0016501b;
          local_88._data = puVar6 + 2;
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 != digitCount);
      if (digitCount != 2) goto LAB_0016502e;
      __nptr = (res->txt)._M_dataplus._M_p;
      piVar7 = __errno_location();
      iVar13 = *piVar7;
      *piVar7 = 0;
      lVar11 = strtol(__nptr,(char **)&local_58,10);
      if ((char *)CONCAT44(uStack_54,local_58) == __nptr) {
        std::__throw_invalid_argument("stoi");
LAB_0016511d:
        uVar8 = std::__throw_out_of_range("stoi");
        if (*piVar7 == 0) {
          *piVar7 = iVar13;
        }
        _Unwind_Resume(uVar8);
      }
      uVar4 = (uint)lVar11;
      if (((int)uVar4 != lVar11) || (*piVar7 == 0x22)) goto LAB_0016511d;
      if (*piVar7 == 0) {
        *piVar7 = iVar13;
      }
      uVar10 = uVar4 + 3;
      if (-1 < (int)uVar4) {
        uVar10 = uVar4;
      }
      if (uVar4 - (uVar10 & 0xfffffffc) != local_8c) goto LAB_0016501b;
    }
    res->format = Any;
    bVar3 = true;
  }
  else {
LAB_0016501b:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool AddOn(PartialResult& res, PatternView begin, int digitCount)
{
	auto ext = begin.subView(0, 3 + digitCount * 4 + (digitCount - 1) * 2);
	CHECK(ext.isValid());
	auto moduleSize = IsPattern(ext, EXT_START_PATTERN);
	CHECK(moduleSize);

	CHECK(ext.isAtLastBar() || *ext.end() > QUIET_ZONE_ADDON * moduleSize - 1);

	res.end = ext;
	ext = ext.subView(EXT_START_PATTERN.size(), CHAR_LEN);
	int lgPattern = 0;
	res.txt.clear();

	for (int i = 0; i < digitCount; ++i) {
		CHECK(DecodeDigit(ext, res.txt, &lgPattern));
		ext.skipSymbol();
		if (i < digitCount - 1) {
			CHECK(IsPattern(ext, EXT_SEPARATOR_PATTERN, 0, 0, moduleSize));
			ext.skipPair();
		}
	}

	if (digitCount == 2) {
		CHECK(std::stoi(res.txt) % 4 == lgPattern);
	} else {
		constexpr int CHECK_DIGIT_ENCODINGS[] = {0x18, 0x14, 0x12, 0x11, 0x0C, 0x06, 0x03, 0x0A, 0x09, 0x05};
		CHECK(Ean5Checksum(res.txt) == IndexOf(CHECK_DIGIT_ENCODINGS, lgPattern));
	}
	res.format = BarcodeFormat::Any; // make sure res.format is valid, see below
	return true;
}